

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void openjtalk_setGvWeight(OpenJTalk *oj,uint i,double f)

{
  long lVar1;
  double f_00;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    return;
  }
  oj->errorCode = OPENJTALKERROR_NO_ERROR;
  f_00 = 0.0;
  if (0.0 <= f) {
    f_00 = f;
  }
  if (i == 0) {
    lVar1 = 0x620;
  }
  else {
    if (i != 1) goto LAB_001442e0;
    lVar1 = 0x628;
  }
  *(double *)(oj->dn_dic_path + lVar1 + -8) = f_00;
LAB_001442e0:
  Open_JTalk_set_gv_weight(oj->open_jtalk,(ulong)i,f_00);
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setGvWeight(OpenJTalk *oj, unsigned int i, double f)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (f < 0.0)
	{
		f = 0.0;
	}
	if (i == 0)
	{
		oj->gv_weight0 = f;
	}
	else if (i == 1)
	{
		oj->gv_weight1 = f;
	}
	Open_JTalk_set_gv_weight(oj->open_jtalk, i, f);
}